

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecOrder.c
# Opt level: O3

Vec_Int_t * Gia_PolynReorder(Gia_Man_t *pGia,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  Vec_Int_t *vFadds;
  Vec_Int_t *vHadds;
  Vec_Int_t *__ptr;
  Vec_Int_t *vNodes;
  int *piVar5;
  Vec_Int_t *pVVar6;
  uint uVar7;
  uint iObj;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int *local_58;
  
  vFadds = Gia_ManDetectFullAdders(pGia,fVeryVerbose,(Vec_Int_t **)0x0);
  vHadds = Gia_ManDetectHalfAdders(pGia,fVeryVerbose);
  __ptr = Gia_PolynFindOrder(pGia,vFadds,vHadds,fVerbose,fVeryVerbose);
  iVar1 = pGia->nObjs;
  uVar7 = ~(pGia->vCos->nSize + pGia->vCis->nSize);
  iVar11 = iVar1 + uVar7;
  vNodes = (Vec_Int_t *)malloc(0x10);
  if ((iVar1 + uVar7) - 1 < 0xf) {
    iVar11 = 0x10;
  }
  piVar5 = (int *)0x0;
  vNodes->nSize = 0;
  vNodes->nCap = iVar11;
  if (iVar11 != 0) {
    piVar5 = (int *)malloc((long)iVar11 << 2);
  }
  vNodes->pArray = piVar5;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar11 = iVar1;
  }
  pVVar6->nCap = iVar11;
  if (iVar11 == 0) {
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = iVar1;
  }
  else {
    local_58 = (int *)malloc((long)iVar11 << 2);
    pVVar6->pArray = local_58;
    pVVar6->nSize = iVar1;
    if (local_58 != (int *)0x0) {
      memset(local_58,0,(long)iVar1 << 2);
      goto LAB_006821fd;
    }
  }
  local_58 = (int *)0x0;
LAB_006821fd:
  Gia_ManIncrementTravId(pGia);
  if (0 < __ptr->nSize) {
    lVar12 = 0;
    do {
      uVar7 = __ptr->pArray[lVar12];
      if ((int)uVar7 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x13d,"int Abc_Lit2Var2(int)");
      }
      iObj = uVar7 >> 2;
      if ((uVar7 & 3) == 1) {
        uVar4 = iObj * 2;
        uVar7 = vHadds->nSize;
        if (uVar7 == uVar4 || SBORROW4(uVar7,uVar4) != (int)(uVar7 + iObj * -2) < 0) {
LAB_0068242a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar5 = vHadds->pArray;
        Gia_ManCollectAnds_rec(pGia,piVar5[uVar4],vNodes);
        iObj = piVar5[(ulong)uVar4 + 1];
LAB_006822a0:
        Gia_ManCollectAnds_rec(pGia,iObj,vNodes);
      }
      else {
        if ((uVar7 & 3) != 2) goto LAB_006822a0;
        if (vFadds->nSize <= (int)(iObj * 5)) goto LAB_0068242a;
        piVar5 = vFadds->pArray;
        lVar10 = 0;
        do {
          Gia_ManCollectAnds_rec(pGia,piVar5[(ulong)iObj * 5 + lVar10 + 3],vNodes);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 2);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < __ptr->nSize);
  }
  pVVar3 = pGia->vCis;
  if (0 < pVVar3->nSize) {
    piVar5 = pVVar3->pArray;
    lVar12 = 0;
    do {
      iVar11 = piVar5[lVar12];
      if (((long)iVar11 < 0) || (pGia->nObjs <= iVar11)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar11 == 0) break;
      if (iVar1 <= iVar11) goto LAB_006823cd;
      lVar12 = lVar12 + 1;
      local_58[iVar11] = (int)lVar12;
    } while (lVar12 < pVVar3->nSize);
  }
  iVar11 = vNodes->nSize;
  if (0 < (long)iVar11) {
    piVar5 = vNodes->pArray;
    uVar9 = 0;
    do {
      iVar2 = piVar5[uVar9];
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
LAB_006823cd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      iVar8 = (int)uVar9;
      uVar9 = uVar9 + 1;
      local_58[iVar2] = pVVar3->nSize + iVar8 + 1;
    } while (uVar9 < (ulong)(long)iVar11);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (vFadds->pArray != (int *)0x0) {
    free(vFadds->pArray);
  }
  free(vFadds);
  if (vHadds->pArray != (int *)0x0) {
    free(vHadds->pArray);
  }
  free(vHadds);
  if (vNodes->pArray != (int *)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  return pVVar6;
}

Assistant:

Vec_Int_t * Gia_PolynReorder( Gia_Man_t * pGia, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vFadds  = Gia_ManDetectFullAdders( pGia, fVeryVerbose, NULL );
    Vec_Int_t * vHadds  = Gia_ManDetectHalfAdders( pGia, fVeryVerbose );
    Vec_Int_t * vRecord = Gia_PolynFindOrder( pGia, vFadds, vHadds, fVerbose, fVeryVerbose );
    Vec_Int_t * vOrder  = Vec_IntAlloc( Gia_ManAndNum(pGia) );
    Vec_Int_t * vOrder2 = Vec_IntStart( Gia_ManObjNum(pGia) );
    int i, k, Entry;

    // collect nodes
    Gia_ManIncrementTravId( pGia );
    Vec_IntForEachEntry( vRecord, Entry, i )
    {
        int Node = Abc_Lit2Var2(Entry);
        int Attr = Abc_Lit2Att2(Entry);
        if ( Attr == 2 )
        {
            int * pFanins = Vec_IntEntryP( vFadds, 5*Node );
            for ( k = 3; k < 5; k++ )
                Gia_ManCollectAnds_rec( pGia, pFanins[k], vOrder );
        }
        else if ( Attr == 1 )
        {
            int * pFanins = Vec_IntEntryP( vHadds, 2*Node );
            for ( k = 0; k < 2; k++ )
                Gia_ManCollectAnds_rec( pGia, pFanins[k], vOrder );
        }
        else
            Gia_ManCollectAnds_rec( pGia, Node, vOrder );
        //printf( "Order = %d.  Node = %d.  Size = %d ", i, Node, Vec_IntSize(vOrder) );
    }
    //printf( "\n" );
    //assert( Vec_IntSize(vOrder) == Gia_ManAndNum(pGia) );

    // remap order
    Gia_ManForEachCiId( pGia, Entry, i )
        Vec_IntWriteEntry( vOrder2, Entry, 1+i );
    Vec_IntForEachEntry( vOrder, Entry, i )
        Vec_IntWriteEntry( vOrder2, Entry, 1+Gia_ManCiNum(pGia)+i );
    //Vec_IntPrint( vOrder );

    Vec_IntFree( vRecord );
    Vec_IntFree( vFadds );
    Vec_IntFree( vHadds );
    Vec_IntFree( vOrder );
    return vOrder2;
}